

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O1

bool __thiscall V4L2Device::write_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  uint uVar1;
  Options *this_00;
  _func_int **__ptr;
  undefined8 uVar2;
  undefined1 uVar3;
  bool bVar4;
  OptionDetails *this_01;
  bool *pbVar5;
  Writer *pWVar6;
  int *piVar7;
  char *__s;
  size_t sVar8;
  bool bVar9;
  undefined1 *puVar10;
  string jpeg_file_name;
  RawImagePtr image;
  fstream result;
  string local_2d0;
  Writer local_2b0;
  undefined1 local_240 [32];
  char *local_220;
  VerboseLevel local_218;
  Logger *local_210;
  bool local_208;
  Logger *local_200;
  char *local_1f8;
  DispatchAction local_1f0;
  pointer local_1e8;
  pointer pbStack_1e0;
  pointer local_1d8;
  
  uVar1 = bufferinfo->index;
  make_jpeg_file_name_abi_cxx11_(&local_2d0,this);
  if (local_2d0._M_string_length == 0) {
    local_240._0_8_ = &PTR__Writer_00164080;
    local_240._8_2_ = Error;
    local_240._16_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_240._24_8_ = 0x1c0;
    local_220 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
    local_218 = 0;
    local_210 = (Logger *)0x0;
    local_208 = false;
    local_200 = (Logger *)0x0;
    local_1f8 = "";
    local_1f0 = NormalLog;
    local_1e8 = (pointer)0x0;
    pbStack_1e0 = (pointer)0x0;
    local_1d8 = (pointer)0x0;
    pWVar6 = el::base::Writer::construct((Writer *)local_240,1,"default");
    if (pWVar6->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50,
                 "couldn\'t create result file name",0x20);
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    el::base::Writer::~Writer((Writer *)local_240);
    bVar9 = false;
    goto LAB_00143e17;
  }
  this_00 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_240._0_8_ = (RawImage *)(local_240 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"save-jpeg-asis","");
  this_01 = cxxopts::Options::operator[](this_00,(string *)local_240);
  pbVar5 = cxxopts::OptionDetails::as<bool>(this_01);
  bVar9 = *pbVar5;
  if ((RawImage *)local_240._0_8_ != (RawImage *)(local_240 + 0x10)) {
    operator_delete((void *)local_240._0_8_);
  }
  if (bVar9 != false) {
    std::fstream::fstream(local_240,(string *)&local_2d0,_S_trunc|_S_out|_S_bin);
    if ((*(byte *)((long)&local_220 + *(long *)(local_240._0_8_ + -0x18)) & 5) == 0) {
      bVar9 = true;
      std::ostream::write(local_240 + 0x10,(long)(this->buffers)._M_elems[uVar1].start);
    }
    else {
      local_2b0._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
      local_2b0.m_level = Error;
      local_2b0.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_2b0.m_line = 0x1c8;
      local_2b0.m_func = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
      local_2b0.m_verboseLevel = 0;
      local_2b0.m_logger = (Logger *)0x0;
      local_2b0.m_proceed = false;
      local_2b0.m_messageBuilder.m_logger = (Logger *)0x0;
      local_2b0.m_messageBuilder.m_containerLogSeperator = "";
      local_2b0.m_dispatchAction = NormalLog;
      local_2b0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b0.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar6 = el::base::Writer::construct(&local_2b0,1,"default");
      if (pWVar6->m_proceed == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50,
                   "open file failed: ",0x12);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      piVar7 = __errno_location();
      __s = strerror(*piVar7);
      if (pWVar6->m_proceed == true) {
        puVar10 = &((pWVar6->m_messageBuilder).m_logger)->field_0x50;
        if (__s == (char *)0x0) {
          std::ios::clear((int)puVar10 + (int)*(undefined8 *)(*(long *)puVar10 + -0x18));
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar10,__s,sVar8);
        }
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      el::base::Writer::~Writer(&local_2b0);
      bVar9 = false;
    }
    std::fstream::~fstream(local_240);
    goto LAB_00143e17;
  }
  local_2b0._vptr_Writer = (_func_int **)0x0;
  decompress_jpeg((V4L2Device *)local_240,(v4l2_buffer *)this);
  uVar2 = local_240._0_8_;
  __ptr = local_2b0._vptr_Writer;
  uVar3 = local_240[8];
  local_240._0_8_ = (RawImage *)0x0;
  local_2b0._vptr_Writer = (_func_int **)uVar2;
  if ((RawImage *)__ptr != (RawImage *)0x0) {
    std::default_delete<V4L2Device::RawImage>::operator()
              ((default_delete<V4L2Device::RawImage> *)&local_2b0,(RawImage *)__ptr);
  }
  if ((RawImage *)local_240._0_8_ != (RawImage *)0x0) {
    std::default_delete<V4L2Device::RawImage>::operator()
              ((default_delete<V4L2Device::RawImage> *)local_240,(RawImage *)local_240._0_8_);
  }
  if (uVar3 == 0) {
    local_240._0_8_ = &PTR__Writer_00164080;
    local_240._8_2_ = Error;
    local_240._16_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_240._24_8_ = 0x1de;
    local_220 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
    local_218 = 0;
    local_210 = (Logger *)0x0;
    local_208 = false;
    local_200 = (Logger *)0x0;
    local_1f8 = "";
    local_1f0 = NormalLog;
    local_1e8 = (pointer)0x0;
    pbStack_1e0 = (pointer)0x0;
    local_1d8 = (pointer)0x0;
    pWVar6 = el::base::Writer::construct((Writer *)local_240,1,"default");
    if (pWVar6->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50,
                 "image decompression failed!",0x1b);
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
LAB_00143d79:
    el::base::Writer::~Writer((Writer *)local_240);
    bVar9 = false;
  }
  else {
    bVar4 = compress_jpeg(this,(RawImagePtr *)&local_2b0,&local_2d0);
    bVar9 = true;
    if (!bVar4) {
      local_240._0_8_ = &PTR__Writer_00164080;
      local_240._8_2_ = Error;
      local_240._16_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_240._24_8_ = 0x1e4;
      local_220 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
      local_218 = 0;
      local_210 = (Logger *)0x0;
      local_208 = false;
      local_200 = (Logger *)0x0;
      local_1f8 = "";
      local_1f0 = NormalLog;
      local_1e8 = (pointer)0x0;
      pbStack_1e0 = (pointer)0x0;
      local_1d8 = (pointer)0x0;
      pWVar6 = el::base::Writer::construct((Writer *)local_240,1,"default");
      if (pWVar6->m_proceed == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50,
                   "image compression failed!",0x19);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      goto LAB_00143d79;
    }
  }
  if ((RawImage *)local_2b0._vptr_Writer != (RawImage *)0x0) {
    std::default_delete<V4L2Device::RawImage>::operator()
              ((default_delete<V4L2Device::RawImage> *)&local_2b0,(RawImage *)local_2b0._vptr_Writer
              );
  }
LAB_00143e17:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  return bVar9;
}

Assistant:

bool
    write_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        auto idx = bufferinfo.index;

        auto jpeg_file_name = make_jpeg_file_name();
        if (jpeg_file_name.empty()) {
            LOG(ERROR) << "couldn't create result file name";
            return false;
        }

        auto save_jpeg_asis = (*options)["save-jpeg-asis"].as<bool>();
        if (save_jpeg_asis) { // store jpeg as we have received it from the camera
            std::fstream result(jpeg_file_name, std::ios::binary | std::ios::out | std::ios::trunc);
            if (result.fail()) {
                LOG(ERROR) << "open file failed: " << strerror(errno);
                return false;
            }

            try {
                result.write(static_cast<const char*>(buffers[idx].start), bufferinfo.length);
            } catch (std::exception& exc) {
                LOG(ERROR) << "write file failed: " << exc.what();
                return false;
            }

            return true;
        }

        // (Re)compress JPEG

        bool ok;
        RawImagePtr image;

        try {
            std::tie(ok, image) = decompress_jpeg(bufferinfo);
            if (not ok) {
                LOG(ERROR) << "image decompression failed!";
                return false;
            }

            ok = compress_jpeg(image, jpeg_file_name);
            if (not ok) {
                LOG(ERROR) << "image compression failed!";
                return false;
            }
        } catch (std::exception& exc) {
            LOG(WARNING) << "image (de)compression failed: " << exc.what();
            return false;
        }

        return true;
    }